

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# casCore.c
# Opt level: O0

DdNode * GetSingleOutputFunctionRemapped
                   (DdManager *dd,DdNode **pOutputs,int nOuts,DdNode **pbVarsEnc,int nVarsEnc)

{
  DdNode *pDVar1;
  DdNode *pDVar2;
  DdNode *aFunc;
  DdNode *bFunc;
  int Counter;
  int i;
  DdNode *bTemp;
  DdNode *bSupp;
  int nVarsEnc_local;
  DdNode **pbVarsEnc_local;
  int nOuts_local;
  DdNode **pOutputs_local;
  DdManager *dd_local;
  
  Cudd_AutodynDisable(dd);
  for (bFunc._4_4_ = 0; bFunc._4_4_ < nOuts; bFunc._4_4_ = bFunc._4_4_ + 1) {
    pDVar1 = Cudd_Support(dd,pOutputs[bFunc._4_4_]);
    Cudd_Ref(pDVar1);
    bFunc._0_4_ = 0;
    for (_Counter = pDVar1; _Counter != dd->one; _Counter = (_Counter->type).kids.T) {
      GetSingleOutputFunctionRemapped::Permute[_Counter->index] = (int)bFunc;
      bFunc._0_4_ = (int)bFunc + 1;
    }
    pDVar2 = Cudd_bddPermute(dd,pOutputs[bFunc._4_4_],GetSingleOutputFunctionRemapped::Permute);
    GetSingleOutputFunctionRemapped::pRemapped[bFunc._4_4_] = pDVar2;
    Cudd_Ref(GetSingleOutputFunctionRemapped::pRemapped[bFunc._4_4_]);
    Cudd_RecursiveDeref(dd,pDVar1);
  }
  pDVar1 = Extra_bddEncodingBinary
                     (dd,GetSingleOutputFunctionRemapped::pRemapped,nOuts,pbVarsEnc,nVarsEnc);
  Cudd_Ref(pDVar1);
  pDVar2 = Cudd_BddToAdd(dd,pDVar1);
  Cudd_Ref(pDVar2);
  Cudd_RecursiveDeref(dd,pDVar1);
  for (bFunc._4_4_ = 0; bFunc._4_4_ < nOuts; bFunc._4_4_ = bFunc._4_4_ + 1) {
    Cudd_RecursiveDeref(dd,GetSingleOutputFunctionRemapped::pRemapped[bFunc._4_4_]);
  }
  Cudd_Deref(pDVar2);
  return pDVar2;
}

Assistant:

DdNode * GetSingleOutputFunctionRemapped( DdManager * dd, DdNode ** pOutputs, int nOuts, DdNode ** pbVarsEnc, int nVarsEnc )
// returns the ADD of the remapped function
{
    static int Permute[MAXINPUTS];
    static DdNode * pRemapped[MAXOUTPUTS];

    DdNode * bSupp, * bTemp;
    int i, Counter;
    DdNode * bFunc;
    DdNode * aFunc;

    Cudd_AutodynDisable(dd);

    // perform the remapping
    for ( i = 0; i < nOuts; i++ )
    {
        // get support
        bSupp = Cudd_Support( dd, pOutputs[i] );    Cudd_Ref( bSupp );

        // create the variable map
        Counter = 0;
        for ( bTemp = bSupp; bTemp != dd->one; bTemp = cuddT(bTemp) )
            Permute[bTemp->index] = Counter++;

        // transfer the BDD and remap it
        pRemapped[i] = Cudd_bddPermute( dd, pOutputs[i], Permute );  Cudd_Ref( pRemapped[i] );

        // remove support
        Cudd_RecursiveDeref( dd, bSupp );
    }
    
    // perform the encoding
    bFunc = Extra_bddEncodingBinary( dd, pRemapped, nOuts, pbVarsEnc, nVarsEnc );   Cudd_Ref( bFunc );

    // convert to ADD
    aFunc = Cudd_BddToAdd( dd, bFunc );  Cudd_Ref( aFunc );
    Cudd_RecursiveDeref( dd, bFunc );

    // deref the intermediate results
    for ( i = 0; i < nOuts; i++ )
        Cudd_RecursiveDeref( dd, pRemapped[i] );

    Cudd_Deref( aFunc );
    return aFunc;
}